

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator>>=(base_uint<256U> *this,uint shift)

{
  long lVar1;
  uint *puVar2;
  sbyte sVar3;
  uint uVar4;
  long lVar5;
  uint32_t uVar6;
  long in_FS_OFFSET;
  base_uint<256U> a;
  base_uint<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_38,this);
  this->pn[4] = 0;
  this->pn[5] = 0;
  this->pn[6] = 0;
  this->pn[7] = 0;
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  sVar3 = (sbyte)(shift & 0x1f);
  uVar4 = (shift >> 5) << 2;
  lVar5 = 0;
  do {
    lVar1 = lVar5 - (ulong)(shift >> 5);
    if (lVar1 < 1 || (shift & 0x1f) == 0) {
      if (-1 < lVar1) {
        uVar6 = local_38.pn[lVar5];
        goto LAB_0082176a;
      }
    }
    else {
      uVar6 = local_38.pn[lVar5];
      puVar2 = (uint *)((long)this + lVar5 * 4 + (-4 - (ulong)uVar4));
      *puVar2 = *puVar2 | uVar6 << (0x20U - sVar3 & 0x1f);
LAB_0082176a:
      puVar2 = (uint *)((long)this + (lVar5 * 4 - (ulong)uVar4));
      *puVar2 = *puVar2 | uVar6 >> sVar3;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return this;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator>>=(unsigned int shift)
{
    base_uint<BITS> a(*this);
    for (int i = 0; i < WIDTH; i++)
        pn[i] = 0;
    int k = shift / 32;
    shift = shift % 32;
    for (int i = 0; i < WIDTH; i++) {
        if (i - k - 1 >= 0 && shift != 0)
            pn[i - k - 1] |= (a.pn[i] << (32 - shift));
        if (i - k >= 0)
            pn[i - k] |= (a.pn[i] >> shift);
    }
    return *this;
}